

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoodsMulti
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *scaleBufferIndices,int count,double *outSumLogLikelihood
          )

{
  float fVar1;
  undefined1 auVar2 [16];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float **ppfVar6;
  double *pdVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  float *pfVar11;
  ulong uVar12;
  int *piVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  int *piVar24;
  int k;
  ulong uVar25;
  float fVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZMM2 [64];
  allocator_type local_b9;
  int *local_b8;
  ulong local_b0;
  long local_a8;
  uint local_9c;
  int *local_98;
  int *local_90;
  int *local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  vector<float,_std::allocator<float>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  
  local_b8 = scaleBufferIndices;
  local_98 = bufferIndices;
  local_90 = categoryWeightsIndices;
  local_88 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&indexMaxScale,(long)this->kPatternCount,(allocator_type *)&maxScaleFactor);
  std::vector<float,_std::allocator<float>_>::vector
            (&maxScaleFactor,(long)this->kPatternCount,&local_b9);
  local_70 = (ulong)(count - 1);
  local_80 = (ulong)(uint)(~(count >> 0x1f) & count);
  piVar13 = local_98;
  piVar24 = local_b8;
  local_68 = (ulong)(uint)count;
  for (uVar19 = 0; uVar19 != local_80; uVar19 = uVar19 + 1) {
    local_78 = (long)piVar13[uVar19];
    uVar9 = this->kPatternCount;
    lVar21 = 0;
    pfVar11 = this->gPartials[local_78];
    pfVar3 = this->gStateFrequencies[local_88[uVar19]];
    pfVar4 = this->gCategoryWeights[local_90[uVar19]];
    uVar18 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
    uVar14 = ~((int)uVar9 >> 0x1f) & uVar9;
    iVar15 = 0;
    uVar20 = uVar18;
    for (uVar22 = 0; uVar22 != uVar14; uVar22 = uVar22 + 1) {
      lVar16 = (long)iVar15;
      pfVar5 = this->integrationTmp;
      iVar15 = iVar15 + uVar18;
      for (lVar10 = 0; (int)uVar20 - lVar16 != lVar10; lVar10 = lVar10 + 1) {
        pfVar5[(int)lVar21 + lVar10] = pfVar11[lVar16 + lVar10] * *pfVar4;
      }
      uVar20 = uVar20 + uVar18;
      lVar21 = (int)lVar21 + lVar10;
    }
    local_a8 = (long)this->kCategoryCount;
    for (lVar21 = 1; lVar21 < local_a8; lVar21 = lVar21 + 1) {
      iVar23 = 0;
      uVar18 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
      uVar20 = uVar18;
      for (uVar22 = 0; uVar22 != uVar14; uVar22 = uVar22 + 1) {
        lVar16 = (long)iVar23;
        pfVar5 = this->integrationTmp;
        for (lVar10 = 0; (int)uVar20 - lVar16 != lVar10; lVar10 = lVar10 + 1) {
          auVar28 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[lVar21]),
                                    ZEXT416((uint)pfVar11[iVar15 + lVar10]),
                                    ZEXT416((uint)pfVar5[lVar16 + lVar10]));
          pfVar5[lVar16 + lVar10] = auVar28._0_4_;
        }
        iVar15 = iVar15 + (int)lVar10;
        uVar20 = uVar20 + uVar18;
        iVar23 = iVar23 + uVar18;
      }
      piVar13 = local_98;
    }
    lVar10 = 0;
    piVar24 = local_b8;
    local_b0 = uVar19;
    local_9c = uVar9;
    for (lVar21 = 0; lVar21 < (int)uVar9; lVar21 = lVar21 + 1) {
      auVar28 = ZEXT816(0) << 0x40;
      uVar25 = (ulong)(uint)(~(this->kStateCount >> 0x1f) & this->kStateCount);
      for (uVar12 = 0; in_ZMM2 = ZEXT1664(auVar28), uVar25 != uVar12; uVar12 = uVar12 + 1) {
        auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)pfVar3[uVar12]),
                                  ZEXT416((uint)this->integrationTmp[(long)(int)lVar10 + uVar12]));
      }
      uVar9 = (uint)this->kFlags;
      if (*piVar24 == -1) {
        if ((uVar9 >> 8 & 1) != 0) goto LAB_001455e2;
      }
      else {
        if ((uVar9 >> 8 & 1) == 0) {
          iVar15 = piVar24[uVar19];
          bVar8 = true;
        }
        else {
LAB_001455e2:
          iVar15 = (int)local_78 - this->kTipCount;
          bVar8 = false;
        }
        ppfVar6 = this->gScaleBuffers;
        pfVar11 = ppfVar6[iVar15];
        if (uVar19 == 0) {
          indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar21] = 0;
          uVar17 = 0;
          fVar26 = pfVar11[lVar21];
          maxScaleFactor.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar21] = fVar26;
          for (uVar12 = 1; uVar19 = local_b0, local_68 != uVar12; uVar12 = uVar12 + 1) {
            if (bVar8) {
              iVar15 = piVar24[uVar12];
            }
            else {
              iVar15 = piVar13[uVar12] - this->kTipCount;
            }
            fVar1 = ppfVar6[iVar15][lVar21];
            if (fVar26 < fVar1) {
              indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar21] = (int)uVar12;
              maxScaleFactor.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar21] = fVar1;
              uVar17 = uVar12 & 0xffffffff;
              fVar26 = fVar1;
            }
          }
        }
        else {
          uVar17 = (ulong)(uint)indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar21];
        }
        if (uVar19 != uVar17) {
          local_a8 = CONCAT44(local_a8._4_4_,auVar28._0_4_);
          dVar27 = exp((double)(pfVar11[lVar21] -
                               maxScaleFactor.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar21]));
          in_ZMM2 = ZEXT864(CONCAT44((int)((ulong)(dVar27 * (double)(float)local_a8) >> 0x20),
                                     (float)(dVar27 * (double)(float)local_a8)));
          uVar19 = local_b0;
          piVar24 = local_b8;
        }
      }
      pfVar11 = this->outLogLikelihoodsTmp;
      if (uVar19 == 0) {
        pfVar11[lVar21] = in_ZMM2._0_4_;
      }
      else {
        fVar26 = in_ZMM2._0_4_ + pfVar11[lVar21];
        if (uVar19 == local_70) {
          dVar27 = log((double)fVar26);
          pfVar11 = this->outLogLikelihoodsTmp;
          fVar26 = (float)dVar27;
          uVar19 = local_b0;
          piVar24 = local_b8;
        }
        pfVar11[lVar21] = fVar26;
      }
      uVar9 = this->kPatternCount;
      lVar10 = (long)(int)lVar10 + uVar25;
    }
  }
  if (*piVar24 == -1) {
    uVar9 = this->kPatternCount;
    if ((this->kFlags & 0x100) == 0) {
      uVar19 = (ulong)(~((int)uVar9 >> 0x1f) & uVar9);
      goto LAB_00145730;
    }
  }
  else {
    uVar9 = this->kPatternCount;
  }
  pfVar11 = this->outLogLikelihoodsTmp;
  uVar19 = (ulong)(~((int)uVar9 >> 0x1f) & uVar9);
  for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
    pfVar11[uVar12] =
         maxScaleFactor.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start[uVar12] + pfVar11[uVar12];
  }
LAB_00145730:
  *outSumLogLikelihood = 0.0;
  auVar28 = ZEXT816(0) << 0x40;
  pdVar7 = this->gPatternWeights;
  pfVar11 = this->outLogLikelihoodsTmp;
  for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
    auVar29._0_8_ = (double)pfVar11[uVar12];
    auVar29._8_8_ = in_ZMM2._8_8_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = pdVar7[uVar12];
    auVar28 = vfmadd231sd_fma(auVar28,auVar29,auVar2);
    *outSumLogLikelihood = auVar28._0_8_;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&maxScaleFactor.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indexMaxScale.super__Vector_base<int,_std::allocator<int>_>);
  return (uint)!NAN(auVar28._0_8_) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsMulti(const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* scaleBufferIndices,
                                                         int count,
                                                         double* outSumLogLikelihood) {
    // Here we do the 3 similar operations:
    //              1. to set the lnL to the contribution of the first subset,
    //              2. to add the lnL for other subsets up to the penultimate
    //              3. to add the final subset and take the lnL
    //      This form of the calc would not work when count == 1 because
    //              we need operation 1 and 3 in the preceding list.  This is not
    //              a problem, though as we deal with count == 1 in the previous
    //              branch.

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const int rootPartialIndex = bufferIndices[subsetIndex];
        const REALTYPE* rootPartials = gPartials[rootPartialIndex];
        const REALTYPE* frequencies = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        int u = 0;
        int v = 0;
        for (int k = 0; k < kPatternCount; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = 0;
            for (int k = 0; k < kPatternCount; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += ((REALTYPE)frequencies[i]) * integrationTmp[u];
                u++;
            }

            // TODO: allow only some subsets to have scale indices
            if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
                int cumulativeScalingFactorIndex;
                if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                    cumulativeScalingFactorIndex = rootPartialIndex - kTipCount;
                else
                    cumulativeScalingFactorIndex = scaleBufferIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                            tmpScaleFactor = gScaleBuffers[bufferIndices[j] - kTipCount][k];
                        else
                            tmpScaleFactor = gScaleBuffers[scaleBufferIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sum *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }

            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sum;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sum;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sum;
            }
        }
    }

    if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;

}